

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu382.c
# Opt level: O2

MPP_RET hal_vp9d_vdpu382_init(void *hal,MppHalCfg *cfg)

{
  MppBufferGroup *group;
  long lVar1;
  SlotHalFbcAdjCfg *pSVar2;
  MPP_RET MVar3;
  void *pvVar4;
  void *pvVar5;
  char *pcVar6;
  long lVar7;
  
  pvVar4 = mpp_osal_calloc("hal_vp9d_vdpu382_init",0x250);
  *(void **)((long)hal + 0x40) = pvVar4;
  if (pvVar4 == (void *)0x0) {
    _mpp_log_l(2,"hal_vp9d_vdpu382","malloc buffer error(%d).\n",(char *)0x0,0xef);
    _mpp_log_l(2,"hal_vp9d_vdpu382","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
               "hal_vp9d_vdpu382_init",0xef);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
    MVar3 = MPP_ERR_MALLOC;
    goto LAB_001fa3b5;
  }
  *(undefined8 *)((long)pvVar4 + 0xf0) = 0xffffffffffffffff;
  mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x18),SLOTS_HOR_ALIGN,vp9_hor_align);
  mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x18),SLOTS_VER_ALIGN,vp9_ver_align);
  group = (MppBufferGroup *)((long)hal + 0x28);
  if ((*(long *)((long)hal + 0x28) != 0) ||
     (MVar3 = mpp_buffer_group_get
                        (group,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_vp9d_vdpu382",
                         "hal_vp9d_vdpu382_init"), MVar3 == MPP_OK)) {
    lVar1 = *(long *)((long)hal + 0x40);
    *(undefined8 *)(lVar1 + 0xd0) = 0x2000;
    *(undefined4 *)(lVar1 + 0xd8) = 0x48000;
    lVar7 = 0;
    do {
      if (lVar7 + 8 == 0x28) {
        MVar3 = mpp_buffer_get_with_tag
                          (*group,(MppBuffer *)(lVar1 + 0xe0),0x1300,"hal_vp9d_vdpu382",
                           "hal_vp9d_alloc_res");
        if (MVar3 != MPP_OK) {
          pcVar6 = "vp9 probe_default_base get buffer failed\n";
          goto LAB_001fa388;
        }
        if (*(int *)((long)hal + 0x38) != 0) {
          lVar7 = 0;
          goto LAB_001fa2b4;
        }
        pvVar5 = mpp_osal_calloc("hal_vp9d_alloc_res",700);
        *(void **)(lVar1 + 0xe8) = pvVar5;
        MVar3 = mpp_buffer_get_with_tag
                          (*group,(MppBuffer *)(lVar1 + 0xc0),0x6000,"hal_vp9d_vdpu382",
                           "hal_vp9d_alloc_res");
        if (MVar3 != MPP_OK) goto LAB_001fa348;
        goto LAB_001fa353;
      }
      MVar3 = mpp_buffer_get_with_tag
                        (*group,(MppBuffer *)(lVar7 + lVar1 + 0x218),0x1300,"hal_vp9d_vdpu382",
                         "hal_vp9d_alloc_res");
      lVar7 = lVar7 + 8;
    } while (MVar3 == MPP_OK);
    pcVar6 = "vp9 probe_loop_base get buffer failed\n";
    goto LAB_001fa388;
  }
  pcVar6 = "vp9 mpp_buffer_group_get failed\n";
  goto LAB_001fa3a2;
LAB_001fa353:
  MVar3 = mpp_buffer_get_with_tag
                    (*group,(MppBuffer *)(lVar1 + 200),0x90000,"hal_vp9d_vdpu382",
                     "hal_vp9d_alloc_res");
  if (MVar3 == MPP_OK) {
    *(undefined4 *)((long)pvVar4 + 0x15c) = 1;
    pSVar2 = cfg->hal_fbc_adj_cfg;
    if (pSVar2 == (SlotHalFbcAdjCfg *)0x0) {
      return MPP_OK;
    }
    pSVar2->func = vdpu382_afbc_align_calc;
    pSVar2->expand = 0;
    return MPP_OK;
  }
  pcVar6 = "vp9 segid_base get buffer failed\n";
  goto LAB_001fa388;
  while( true ) {
    pvVar5 = mpp_osal_calloc("hal_vp9d_alloc_res",700);
    *(void **)(lVar1 + 0x30 + lVar7) = pvVar5;
    MVar3 = mpp_buffer_get_with_tag
                      (*group,(MppBuffer *)(lVar7 + lVar1 + 0x10),0x6000,"hal_vp9d_vdpu382",
                       "hal_vp9d_alloc_res");
    lVar7 = lVar7 + 0x40;
    if (MVar3 != MPP_OK) break;
LAB_001fa2b4:
    if (lVar7 + 0x40 == 0x100) goto LAB_001fa353;
  }
LAB_001fa348:
  pcVar6 = "vp9 probe_base get buffer failed\n";
LAB_001fa388:
  _mpp_log_l(2,"hal_vp9d_vdpu382",pcVar6,(char *)0x0);
  pcVar6 = "hal_vp9d_alloc_res failed\n";
LAB_001fa3a2:
  _mpp_log_l(2,"hal_vp9d_vdpu382",pcVar6,(char *)0x0);
LAB_001fa3b5:
  hal_vp9d_vdpu382_deinit(hal);
  return MVar3;
}

Assistant:

static MPP_RET hal_vp9d_vdpu382_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    HalVp9dCtx *p_hal = (HalVp9dCtx*)hal;
    MEM_CHECK(ret, p_hal->hw_ctx = mpp_calloc_size(void, sizeof(Vdpu382Vp9dCtx)));
    Vdpu382Vp9dCtx *hw_ctx = (Vdpu382Vp9dCtx*)p_hal->hw_ctx;

    hw_ctx->mv_base_addr = -1;
    hw_ctx->pre_mv_base_addr = -1;
    mpp_slots_set_prop(p_hal->slots, SLOTS_HOR_ALIGN, vp9_hor_align);
    mpp_slots_set_prop(p_hal->slots, SLOTS_VER_ALIGN, vp9_ver_align);

    if (p_hal->group == NULL) {
        ret = mpp_buffer_group_get_internal(&p_hal->group, MPP_BUFFER_TYPE_ION);
        if (ret) {
            mpp_err("vp9 mpp_buffer_group_get failed\n");
            goto __FAILED;
        }
    }

    ret = hal_vp9d_alloc_res(p_hal);
    if (ret) {
        mpp_err("hal_vp9d_alloc_res failed\n");
        goto __FAILED;
    }

    hw_ctx->last_segid_flag = 1;

    if (cfg->hal_fbc_adj_cfg) {
        cfg->hal_fbc_adj_cfg->func = vdpu382_afbc_align_calc;
        cfg->hal_fbc_adj_cfg->expand = 0;
    }

    return ret;
__FAILED:
    hal_vp9d_vdpu382_deinit(hal);
    return ret;
}